

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  ITracker *pIVar1;
  SourceLineInfo *in_RDI;
  unique_ptr<Catch::TestCaseTracking::SectionTracker> *in_stack_ffffffffffffff58;
  string *_name;
  NameAndLocation *this_00;
  TrackerContext *in_stack_ffffffffffffff80;
  NameAndLocation *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_60 [3];
  
  _name = local_60;
  s_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  this_00 = (NameAndLocation *)&stack0xffffffffffffff90;
  SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
             ,0x1a34);
  NameAndLocation::NameAndLocation(this_00,_name,in_RDI);
  Detail::
  make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(void **)0x0);
  Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator=
            ((unique_ptr<Catch::TestCaseTracking::ITracker> *)in_RDI,in_stack_ffffffffffffff58);
  Detail::unique_ptr<Catch::TestCaseTracking::SectionTracker>::~unique_ptr
            ((unique_ptr<Catch::TestCaseTracking::SectionTracker> *)in_RDI);
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x18f32a);
  std::__cxx11::string::~string((string *)local_60);
  in_RDI->line = 0;
  *(undefined4 *)&in_RDI[1].file = 1;
  pIVar1 = Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator*
                     ((unique_ptr<Catch::TestCaseTracking::ITracker> *)in_RDI);
  return pIVar1;
}

Assistant:

ITracker& TrackerContext::startRun() {
        using namespace std::string_literals;
        m_rootTracker = Catch::Detail::make_unique<SectionTracker>(
            NameAndLocation( "{root}"s, CATCH_INTERNAL_LINEINFO ),
            *this,
            nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }